

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O0

void server::pban_cmd(int cid,char **args,int argc)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  clientinfo *pcVar5;
  char *pcVar6;
  clientinfo *ci_1;
  clientinfo *ci;
  int cn;
  bool usage;
  int argc_local;
  char **args_local;
  int cid_local;
  
  bVar1 = false;
  bVar2 = QServ::getlastSA(&qs);
  if (bVar2) {
    iVar4 = atoi(args[1]);
    if ((iVar4 < 0) || (1000 < iVar4)) {
      bVar1 = true;
    }
    else {
      pcVar5 = QServ::getClient(&qs,iVar4);
      if (pcVar5 == (clientinfo *)0x0) {
        iVar4 = QServ::getSender(&qs);
        sendf(iVar4,1,"ris",0x23,"\f3Error: Player not connected");
      }
      else if ((((((pcVar5->connected & 1U) != 0) && (iVar3 = QServ::getSender(&qs), iVar4 != iVar3)
                 ) && (-1 < iVar4)) && ((iVar4 < 0x3e9 && (pcVar5 != (clientinfo *)0x0)))) &&
              (((pcVar5->connected & 1U) != 0 &&
               ((args[1] != (char *)0x0 && (iVar3 = QServ::getSender(&qs), iVar4 != iVar3)))))) {
        pcVar5 = QServ::getClient(&qs,iVar4);
        pcVar6 = colorname(pcVar5);
        out(3,"\f0%s \f7has been permanently banned.",pcVar6);
        pcVar6 = colorname(pcVar5);
        out(4,"%s has been permanently banned.",pcVar6);
        ipban(pcVar5->ip);
        disconnect_client(iVar4,5);
      }
    }
  }
  else {
    QServ::getSender(&qs);
    bVar1 = true;
  }
  if (bVar1) {
    iVar4 = QServ::getSender(&qs);
    pcVar6 = QServ::getCommandDesc(&qs,cid);
    sendf(iVar4,1,"ris",0x23,pcVar6);
  }
  return;
}

Assistant:

QSERV_CALLBACK pban_cmd(p) {
        bool usage = false;
        int cn = -1;
        if(CMD_SA) {
            cn = atoi(args[1]);
            if(cn >= 0 && cn <= 1000) {
                clientinfo *ci = qs.getClient(cn);
                if(ci != NULL) {
                    if(ci->connected) {
                        if(cn!=CMD_SENDER && cn >= 0 && cn <= 1000 && ci != NULL && ci->connected && args[1] != NULL && cn!=CMD_SENDER) {
                            //ipban doesn't get listed on listbans
                            clientinfo *ci = qs.getClient(cn);
                            out(ECHO_SERV, "\f0%s \f7has been permanently banned.", colorname(ci));
                            out(ECHO_NOCOLOR, "%s has been permanently banned.", colorname(ci));
                            server::ipban(ci->ip);
                            disconnect_client(cn, DISC_IPBAN);
                        }
                    }
                } else {
                    sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Player not connected");
                }
                
            } else {
                usage = true;
            }
        } else {
            cn = CMD_SENDER;
            usage = true;
        }
        if(usage) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }